

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O0

int CVAckpntGet(CVodeMem cv_mem,CVckpntMem ck_mem)

{
  int iVar1;
  undefined8 *in_RSI;
  long in_RDI;
  int retval;
  int qmax;
  int is;
  int j;
  int flag;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (in_RSI[0x66] == 0) {
    CVodeSetInitStep((void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (sunrealtype)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    iVar1 = CVodeReInit(in_RSI,(sunrealtype)
                               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (N_Vector)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (iVar1 != 0) {
      return iVar1;
    }
    if ((*(int *)(in_RSI + 0xf) != 0) &&
       (iVar1 = CVodeQuadReInit((void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),
                                (N_Vector)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
       iVar1 != 0)) {
      return iVar1;
    }
    if ((*(int *)(in_RSI + 0x1d) != 0) &&
       (iVar1 = CVodeSensReInit(in_RSI,0,(N_Vector *)
                                         CONCAT44(in_stack_ffffffffffffffdc,
                                                  in_stack_ffffffffffffffd8)), iVar1 != 0)) {
      return iVar1;
    }
    if ((*(int *)(in_RSI + 0x2b) != 0) &&
       (iVar1 = CVodeQuadSensReInit((void *)CONCAT44(in_stack_ffffffffffffffdc,
                                                     in_stack_ffffffffffffffd8),
                                    (N_Vector *)
                                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
       iVar1 != 0)) {
      return iVar1;
    }
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x598);
    *(undefined8 *)(in_RDI + 0x628) = in_RSI[0x3a];
    *(undefined8 *)(in_RDI + 0x410) = in_RSI[0x3b];
    *(undefined4 *)(in_RDI + 0x3c0) = *(undefined4 *)(in_RSI + 0x3c);
    *(undefined4 *)(in_RDI + 0x3c4) = *(undefined4 *)((long)in_RSI + 0x1e4);
    *(undefined4 *)(in_RDI + 0x3cc) = *(undefined4 *)(in_RSI + 0x3d);
    *(undefined4 *)(in_RDI + 0x3d0) = *(undefined4 *)((long)in_RSI + 0x1ec);
    *(undefined8 *)(in_RDI + 0x530) = in_RSI[0x3e];
    *(undefined8 *)(in_RDI + 0x3e0) = in_RSI[0x3f];
    *(undefined8 *)(in_RDI + 1000) = in_RSI[0x40];
    *(undefined8 *)(in_RDI + 0x400) = in_RSI[0x41];
    *(undefined8 *)(in_RDI + 0x3f8) = in_RSI[0x42];
    *(undefined8 *)(in_RDI + 0x5c8) = in_RSI[0x43];
    *(undefined8 *)(in_RDI + 0x408) = *in_RSI;
    *(undefined8 *)(in_RDI + 0x818) = in_RSI[0x65];
    for (iVar3 = 0; iVar3 <= *(int *)(in_RDI + 0x3c0); iVar3 = iVar3 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0xa50) + (long)iVar3 * 8) = 0x3ff0000000000000;
    }
    iVar3 = N_VScaleVectorArray(*(int *)(in_RDI + 0x3c0) + 1,*(undefined8 *)(in_RDI + 0xa50),
                                in_RSI + 2,in_RDI + 0x150);
    if (iVar3 != 0) {
      return -0x1c;
    }
    if (*(int *)(in_RDI + 0x3c0) < iVar1) {
      N_VScale(0x3ff0000000000000,in_RSI[(long)iVar1 + 2],
               *(undefined8 *)(in_RDI + 0x150 + (long)iVar1 * 8));
    }
    if (*(int *)(in_RSI + 0xf) != 0) {
      for (iVar3 = 0; iVar3 <= *(int *)(in_RDI + 0x3c0); iVar3 = iVar3 + 1) {
        *(undefined8 *)(*(long *)(in_RDI + 0xa50) + (long)iVar3 * 8) = 0x3ff0000000000000;
      }
      iVar3 = N_VScaleVectorArray(*(int *)(in_RDI + 0x3c0) + 1,*(undefined8 *)(in_RDI + 0xa50),
                                  in_RSI + 0x10,in_RDI + 0x200);
      if (iVar3 != 0) {
        return -0x1c;
      }
      if (*(int *)(in_RDI + 0x3c0) < iVar1) {
        N_VScale(0x3ff0000000000000,in_RSI[(long)iVar1 + 0x10],
                 *(undefined8 *)(in_RDI + 0x200 + (long)iVar1 * 8));
      }
    }
    if (*(int *)(in_RSI + 0x1d) != 0) {
      for (iVar3 = 0; iVar3 <= *(int *)(in_RDI + 0x3c0); iVar3 = iVar3 + 1) {
        for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x90); iVar2 = iVar2 + 1) {
          *(undefined8 *)
           (*(long *)(in_RDI + 0xa50) + (long)(iVar3 * *(int *)(in_RDI + 0x90) + iVar2) * 8) =
               0x3ff0000000000000;
          *(undefined8 *)
           (*(long *)(in_RDI + 0xa58) + (long)(iVar3 * *(int *)(in_RDI + 0x90) + iVar2) * 8) =
               *(undefined8 *)(in_RSI[(long)iVar3 + 0x1e] + (long)iVar2 * 8);
          *(undefined8 *)
           (*(long *)(in_RDI + 0xa60) + (long)(iVar3 * *(int *)(in_RDI + 0x90) + iVar2) * 8) =
               *(undefined8 *)(*(long *)(in_RDI + 0x288 + (long)iVar3 * 8) + (long)iVar2 * 8);
        }
      }
      iVar3 = N_VScaleVectorArray(*(int *)(in_RDI + 0x90) * (*(int *)(in_RDI + 0x3c0) + 1),
                                  *(undefined8 *)(in_RDI + 0xa50),*(undefined8 *)(in_RDI + 0xa58),
                                  *(undefined8 *)(in_RDI + 0xa60));
      if (iVar3 != 0) {
        return -0x1c;
      }
      if (*(int *)(in_RDI + 0x3c0) < iVar1) {
        for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 0x90); iVar3 = iVar3 + 1) {
          *(undefined8 *)(*(long *)(in_RDI + 0xa50) + (long)iVar3 * 8) = 0x3ff0000000000000;
        }
        iVar3 = N_VScaleVectorArray(*(undefined4 *)(in_RDI + 0x90),*(undefined8 *)(in_RDI + 0xa50),
                                    in_RSI[(long)iVar1 + 0x1e],
                                    *(undefined8 *)(in_RDI + 0x288 + (long)iVar1 * 8));
        if (iVar3 != 0) {
          return -0x1c;
        }
      }
    }
    if (*(int *)(in_RSI + 0x2b) != 0) {
      for (iVar3 = 0; iVar3 <= *(int *)(in_RDI + 0x3c0); iVar3 = iVar3 + 1) {
        for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x90); iVar2 = iVar2 + 1) {
          *(undefined8 *)
           (*(long *)(in_RDI + 0xa50) + (long)(iVar3 * *(int *)(in_RDI + 0x90) + iVar2) * 8) =
               0x3ff0000000000000;
          *(undefined8 *)
           (*(long *)(in_RDI + 0xa58) + (long)(iVar3 * *(int *)(in_RDI + 0x90) + iVar2) * 8) =
               *(undefined8 *)(in_RSI[(long)iVar3 + 0x2c] + (long)iVar2 * 8);
          *(undefined8 *)
           (*(long *)(in_RDI + 0xa60) + (long)(iVar3 * *(int *)(in_RDI + 0x90) + iVar2) * 8) =
               *(undefined8 *)(*(long *)(in_RDI + 800 + (long)iVar3 * 8) + (long)iVar2 * 8);
        }
      }
      iVar3 = N_VScaleVectorArray(*(int *)(in_RDI + 0x90) * (*(int *)(in_RDI + 0x3c0) + 1),
                                  *(undefined8 *)(in_RDI + 0xa50),*(undefined8 *)(in_RDI + 0xa58),
                                  *(undefined8 *)(in_RDI + 0xa60));
      if (iVar3 != 0) {
        return -0x1c;
      }
      if (*(int *)(in_RDI + 0x3c0) < iVar1) {
        for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 0x90); iVar3 = iVar3 + 1) {
          *(undefined8 *)(*(long *)(in_RDI + 0xa50) + (long)iVar3 * 8) = 0x3ff0000000000000;
        }
        iVar1 = N_VScaleVectorArray(*(undefined4 *)(in_RDI + 0x90),*(undefined8 *)(in_RDI + 0xa50),
                                    in_RSI[(long)iVar1 + 0x2c],
                                    *(undefined8 *)(in_RDI + 800 + (long)iVar1 * 8));
        if (iVar1 != 0) {
          return -0x1c;
        }
      }
    }
    for (iVar1 = 0; iVar1 < 0xe; iVar1 = iVar1 + 1) {
      *(undefined8 *)(in_RDI + 0x418 + (long)iVar1 * 8) = in_RSI[(long)iVar1 + 0x44];
    }
    for (iVar1 = 0; iVar1 < 6; iVar1 = iVar1 + 1) {
      *(undefined8 *)(in_RDI + 0x488 + (long)iVar1 * 8) = in_RSI[(long)iVar1 + 0x52];
    }
    for (iVar1 = 0; iVar1 <= *(int *)(in_RDI + 0x3c0); iVar1 = iVar1 + 1) {
      *(undefined8 *)(in_RDI + 0x4b8 + (long)iVar1 * 8) = in_RSI[(long)iVar1 + 0x58];
    }
    *(undefined4 *)(in_RDI + 0x7f8) = 1;
  }
  return 0;
}

Assistant:

static int CVAckpntGet(CVodeMem cv_mem, CVckpntMem ck_mem)
{
  int flag, j, is, qmax, retval;

  if (ck_mem->ck_next == NULL)
  {
    /* In this case, we just call the reinitialization routine,
     * but make sure we use the same initial stepsize as on
     * the first run. */

    CVodeSetInitStep(cv_mem, cv_mem->cv_h0u);

    flag = CVodeReInit(cv_mem, ck_mem->ck_t0, ck_mem->ck_zn[0]);
    if (flag != CV_SUCCESS) { return (flag); }

    if (ck_mem->ck_quadr)
    {
      flag = CVodeQuadReInit(cv_mem, ck_mem->ck_znQ[0]);
      if (flag != CV_SUCCESS) { return (flag); }
    }

    if (ck_mem->ck_sensi)
    {
      flag = CVodeSensReInit(cv_mem, cv_mem->cv_ism, ck_mem->ck_znS[0]);
      if (flag != CV_SUCCESS) { return (flag); }
    }

    if (ck_mem->ck_quadr_sensi)
    {
      flag = CVodeQuadSensReInit(cv_mem, ck_mem->ck_znQS[0]);
      if (flag != CV_SUCCESS) { return (flag); }
    }
  }
  else
  {
    qmax = cv_mem->cv_qmax;

    /* Copy parameters from check point data structure */

    cv_mem->cv_nst       = ck_mem->ck_nst;
    cv_mem->cv_tretlast  = ck_mem->ck_tretlast;
    cv_mem->cv_q         = ck_mem->ck_q;
    cv_mem->cv_qprime    = ck_mem->ck_qprime;
    cv_mem->cv_qwait     = ck_mem->ck_qwait;
    cv_mem->cv_L         = ck_mem->ck_L;
    cv_mem->cv_gammap    = ck_mem->ck_gammap;
    cv_mem->cv_h         = ck_mem->ck_h;
    cv_mem->cv_hprime    = ck_mem->ck_hprime;
    cv_mem->cv_hscale    = ck_mem->ck_hscale;
    cv_mem->cv_eta       = ck_mem->ck_eta;
    cv_mem->cv_etamax    = ck_mem->ck_etamax;
    cv_mem->cv_tn        = ck_mem->ck_t0;
    cv_mem->cv_saved_tq5 = ck_mem->ck_saved_tq5;

    /* Copy the arrays from check point data structure */

    for (j = 0; j <= cv_mem->cv_q; j++) { cv_mem->cv_cvals[j] = ONE; }

    retval = N_VScaleVectorArray(cv_mem->cv_q + 1, cv_mem->cv_cvals,
                                 ck_mem->ck_zn, cv_mem->cv_zn);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

    if (cv_mem->cv_q < qmax)
    {
      N_VScale(ONE, ck_mem->ck_zn[qmax], cv_mem->cv_zn[qmax]);
    }

    if (ck_mem->ck_quadr)
    {
      for (j = 0; j <= cv_mem->cv_q; j++) { cv_mem->cv_cvals[j] = ONE; }

      retval = N_VScaleVectorArray(cv_mem->cv_q + 1, cv_mem->cv_cvals,
                                   ck_mem->ck_znQ, cv_mem->cv_znQ);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

      if (cv_mem->cv_q < qmax)
      {
        N_VScale(ONE, ck_mem->ck_znQ[qmax], cv_mem->cv_znQ[qmax]);
      }
    }

    if (ck_mem->ck_sensi)
    {
      for (j = 0; j <= cv_mem->cv_q; j++)
      {
        for (is = 0; is < cv_mem->cv_Ns; is++)
        {
          cv_mem->cv_cvals[j * cv_mem->cv_Ns + is] = ONE;
          cv_mem->cv_Xvecs[j * cv_mem->cv_Ns + is] = ck_mem->ck_znS[j][is];
          cv_mem->cv_Zvecs[j * cv_mem->cv_Ns + is] = cv_mem->cv_znS[j][is];
        }
      }

      retval = N_VScaleVectorArray(cv_mem->cv_Ns * (cv_mem->cv_q + 1),
                                   cv_mem->cv_cvals, cv_mem->cv_Xvecs,
                                   cv_mem->cv_Zvecs);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

      if (cv_mem->cv_q < qmax)
      {
        for (is = 0; is < cv_mem->cv_Ns; is++) { cv_mem->cv_cvals[is] = ONE; }

        retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                     ck_mem->ck_znS[qmax], cv_mem->cv_znS[qmax]);
        if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
      }
    }

    if (ck_mem->ck_quadr_sensi)
    {
      for (j = 0; j <= cv_mem->cv_q; j++)
      {
        for (is = 0; is < cv_mem->cv_Ns; is++)
        {
          cv_mem->cv_cvals[j * cv_mem->cv_Ns + is] = ONE;
          cv_mem->cv_Xvecs[j * cv_mem->cv_Ns + is] = ck_mem->ck_znQS[j][is];
          cv_mem->cv_Zvecs[j * cv_mem->cv_Ns + is] = cv_mem->cv_znQS[j][is];
        }
      }

      retval = N_VScaleVectorArray(cv_mem->cv_Ns * (cv_mem->cv_q + 1),
                                   cv_mem->cv_cvals, cv_mem->cv_Xvecs,
                                   cv_mem->cv_Zvecs);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

      if (cv_mem->cv_q < qmax)
      {
        for (is = 0; is < cv_mem->cv_Ns; is++) { cv_mem->cv_cvals[is] = ONE; }

        retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                     ck_mem->ck_znQS[qmax],
                                     cv_mem->cv_znQS[qmax]);
        if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
      }
    }

    for (j = 0; j <= L_MAX; j++) { cv_mem->cv_tau[j] = ck_mem->ck_tau[j]; }
    for (j = 0; j <= NUM_TESTS; j++) { cv_mem->cv_tq[j] = ck_mem->ck_tq[j]; }
    for (j = 0; j <= cv_mem->cv_q; j++) { cv_mem->cv_l[j] = ck_mem->ck_l[j]; }

    /* Force a call to setup */

    cv_mem->cv_forceSetup = SUNTRUE;
  }

  return (CV_SUCCESS);
}